

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbabilityEval.cpp
# Opt level: O2

unordered_map<string,_char2double> * __thiscall
ProbMap::createTransitionDict
          (unordered_map<string,_char2double> *__return_storage_ptr__,ProbMap *this,
          string2int32 *freq_dict)

{
  int iVar1;
  int32_t iVar2;
  int32_t iVar3;
  int32_t iVar4;
  int32_t iVar5;
  Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  initializer_list<robin_hood::pair<char,_double>_> initlist;
  initializer_list<robin_hood::pair<char,_double>_> initlist_00;
  initializer_list<robin_hood::pair<char,_double>_> initlist_01;
  equal_to<char> local_162;
  hash<char,_void> local_161;
  unordered_map<string,_char2double> *local_160;
  string2int32 *local_158;
  ProbMap *local_150;
  pair<char,_double> local_148;
  undefined8 uStack_138;
  double dStack_130;
  undefined8 uStack_128;
  double dStack_120;
  undefined8 uStack_118;
  double dStack_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  iterator __begin1;
  Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_> local_e8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_160 = __return_storage_ptr__;
  local_150 = this;
  calcFirstBase(__return_storage_ptr__,this,freq_dict);
  __begin1 = robin_hood::detail::
             Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(freq_dict);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)freq_dict->mInfo;
  __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__begin1.mKeyVals;
  local_158 = freq_dict;
  while( true ) {
    if (__str == local_100) break;
    if ((int)__str->_M_string_length < local_150->codewordLen) {
      std::__cxx11::string::string((string *)&local_70,__str);
      iVar2 = checkFd(&local_70,'A',freq_dict);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::string((string *)&local_90,__str);
      iVar3 = checkFd(&local_90,'T',freq_dict);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::string((string *)&local_b0,__str);
      iVar4 = checkFd(&local_b0,'G',freq_dict);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::string((string *)&local_50,__str);
      iVar5 = checkFd(&local_50,'C',freq_dict);
      std::__cxx11::string::~string((string *)&local_50);
      if (local_150->normalized == true) {
        iVar1 = *(int *)&__str[1]._M_dataplus._M_p;
        if (iVar1 == 0) {
          local_148.first = 'A';
          local_148._1_7_ = 0;
          local_148.second = 0.0;
          uStack_138 = 0x54;
          dStack_130 = 0.0;
          uStack_128 = 0x43;
          dStack_120 = 0.0;
          uStack_118 = 0x47;
          dStack_110 = 0.0;
          initlist_01._M_len = 4;
          initlist_01._M_array = &local_148;
          robin_hood::detail::
          Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::Table
                    (&local_e8,initlist_01,0,&local_161,&local_162);
          freq_dict = local_158;
          this_00 = robin_hood::detail::
                    Table<false,80ul,std::__cxx11::string,robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                    ::
                    operator[]<robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>>
                              ((Table<false,80ul,std::__cxx11::string,robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                                *)local_160,__str);
        }
        else {
          local_148.first = 'A';
          dStack_110 = 1.0 / (double)iVar1;
          local_148.second = (double)iVar2 * dStack_110;
          uStack_138 = CONCAT71(uStack_138._1_7_,0x54);
          dStack_130 = (double)iVar3 * dStack_110;
          uStack_128 = CONCAT71(uStack_128._1_7_,0x43);
          dStack_120 = (double)iVar5 * dStack_110;
          dStack_110 = (double)iVar4 * dStack_110;
          uStack_118 = CONCAT71(uStack_118._1_7_,0x47);
          initlist._M_len = 4;
          initlist._M_array = &local_148;
          robin_hood::detail::
          Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::Table
                    (&local_e8,initlist,0,&local_161,&local_162);
          this_00 = robin_hood::detail::
                    Table<false,80ul,std::__cxx11::string,robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                    ::
                    operator[]<robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>>
                              ((Table<false,80ul,std::__cxx11::string,robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                                *)local_160,__str);
          freq_dict = local_158;
        }
      }
      else {
        local_148.second = (double)iVar2;
        local_148.first = 'A';
        dStack_130 = (double)iVar3;
        uStack_138 = CONCAT71(uStack_138._1_7_,0x54);
        dStack_120 = (double)iVar5;
        uStack_128 = CONCAT71(uStack_128._1_7_,0x43);
        dStack_110 = (double)iVar4;
        uStack_118 = CONCAT71(uStack_118._1_7_,0x47);
        initlist_00._M_len = 4;
        initlist_00._M_array = &local_148;
        robin_hood::detail::
        Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::Table
                  (&local_e8,initlist_00,0,&local_161,&local_162);
        this_00 = robin_hood::detail::
                  Table<false,80ul,std::__cxx11::string,robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                  ::
                  operator[]<robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>>
                            ((Table<false,80ul,std::__cxx11::string,robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                              *)local_160,__str);
        freq_dict = local_158;
      }
      robin_hood::detail::
      Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::operator=
                (this_00,&local_e8);
      robin_hood::detail::
      Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::destroy
                (&local_e8);
    }
    robin_hood::detail::
    Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::Iter<false>::operator++(&__begin1);
    __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__begin1.mKeyVals;
  }
  return local_160;
}

Assistant:

robin_hood::unordered_map<string, char2double> ProbMap::createTransitionDict(string2int32 &freq_dict) {
    robin_hood::unordered_map<string, char2double> fd_map = calcFirstBase(freq_dict);
    for (const auto &ele: freq_dict) {
        if ((int)ele.first.length() < codewordLen) {
            int32_t A = checkFd(ele.first, 'A', freq_dict);
            int32_t T = checkFd(ele.first, 'T', freq_dict);
            int32_t G = checkFd(ele.first, 'G', freq_dict);
            int32_t C = checkFd(ele.first, 'C', freq_dict);
            if (normalized) {
                double csum = ele.second;//A + T + G + C;
                if (static_cast<bool>(csum)) {
                    fd_map[ele.first] = {{'A', 1.0 * A / csum},
                                         {'T', 1.0 * T / csum},
                                         {'C', 1.0 * C / csum},
                                         {'G', 1.0 * G / csum}};
                } else {
                    fd_map[ele.first] = {{'A', 0.0},
                                         {'T', 0.0},
                                         {'C', 0.0},
                                         {'G', 0.0}};
                }
            } else {
                fd_map[ele.first] = {{'A', A},
                                     {'T', T},
                                     {'C', C},
                                     {'G', G}};
            }
        }
    }
    return fd_map;
}